

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<unsigned_int,long,9>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,long *rhs,uint *result)

{
  uint uVar1;
  ulong uVar2;
  code *pcVar3;
  uint uVar4;
  int *in_RDX;
  ulong *in_RSI;
  uint *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    if ((ulong)*in_RDI < (*in_RSI ^ 0xffffffffffffffff) + 1) {
LAB_00191f10:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (SCARRY8((ulong)*in_RDI,*in_RSI)) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_RDX = *in_RDI + (int)*in_RSI;
  }
  else {
    uVar1 = *in_RDI;
    uVar2 = *in_RSI;
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if ((ulong)uVar4 < uVar1 + uVar2) goto LAB_00191f10;
    *in_RDX = (int)(uVar1 + uVar2);
  }
  return;
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}